

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O0

void __thiscall
gvr::ColoredMesh::ColoredMesh
          (ColoredMesh *this,ColoredMesh *p,vector<bool,_std::allocator<bool>_> *vused,
          vector<bool,_std::allocator<bool>_> *tused)

{
  const_reference cVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  ColoredMesh *in_RSI;
  PointCloud *in_RDI;
  ulong uVar6;
  int i;
  int k;
  Mesh *in_stack_00000058;
  Mesh *in_stack_00000060;
  int iVar7;
  int i_00;
  int iVar8;
  undefined4 in_stack_ffffffffffffffd4;
  
  Mesh::Mesh(in_stack_00000060,in_stack_00000058,(vector<bool,_std::allocator<bool>_> *)this,
             (vector<bool,_std::allocator<bool>_> *)p);
  (in_RDI->super_Model)._vptr_Model = (_func_int **)&PTR__ColoredMesh_0016a9c8;
  iVar3 = PointCloud::getVertexCount(in_RDI);
  uVar6 = (ulong)(iVar3 * 3);
  if ((long)uVar6 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar6);
  in_RDI[1].super_Model.origin.v[1] = (double)pvVar5;
  iVar8 = 0;
  iVar7 = 0;
  while (i_00 = iVar7, iVar4 = PointCloud::getVertexCount((PointCloud *)in_RSI), iVar7 < iVar4) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_ffffffffffffffd4,iVar8),CONCAT44(i_00,iVar3));
    if (cVar1) {
      uVar2 = getColorComp(in_RSI,i_00,0);
      iVar7 = iVar8 + 1;
      *(uchar *)((long)in_RDI[1].super_Model.origin.v[1] + (long)iVar8) = uVar2;
      uVar2 = getColorComp(in_RSI,i_00,1);
      iVar4 = iVar7 + 1;
      *(uchar *)((long)in_RDI[1].super_Model.origin.v[1] + (long)iVar7) = uVar2;
      uVar2 = getColorComp(in_RSI,i_00,2);
      iVar8 = iVar4 + 1;
      *(uchar *)((long)in_RDI[1].super_Model.origin.v[1] + (long)iVar4) = uVar2;
    }
    iVar7 = i_00 + 1;
  }
  return;
}

Assistant:

ColoredMesh::ColoredMesh(const ColoredMesh &p, const std::vector<bool> &vused,
                         const std::vector<bool> &tused) : Mesh(p, vused, tused)
{
  rgb=new unsigned char [3*getVertexCount()];

  int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      rgb[k++]=p.getColorComp(i, 0);
      rgb[k++]=p.getColorComp(i, 1);
      rgb[k++]=p.getColorComp(i, 2);
    }
  }
}